

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::python::Generator::
FixContainingTypeInDescriptor<google::protobuf::EnumDescriptor>
          (Generator *this,EnumDescriptor *descriptor,Descriptor *containing_descriptor)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  char (*in_RSI) [12];
  char *in_RDI;
  Printer *unaff_retaddr;
  string parent_name;
  string nested_name;
  Generator *in_stack_00000078;
  EnumDescriptor *in_stack_00000080;
  Generator *in_stack_00000088;
  string local_58 [32];
  string local_38 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  char (*in_stack_ffffffffffffffe0) [12];
  
  if (in_RDX != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    ModuleLevelDescriptorName<google::protobuf::EnumDescriptor>(in_stack_00000088,in_stack_00000080)
    ;
    ModuleLevelDescriptorName<google::protobuf::Descriptor>(in_stack_00000078,(Descriptor *)this);
    io::Printer::Print<char[12],std::__cxx11::string,char[12],std::__cxx11::string>
              (unaff_retaddr,in_RDI,in_RSI,in_RDX,in_stack_ffffffffffffffe0,
               in_stack_ffffffffffffffd8);
    std::__cxx11::string::~string(local_58);
    std::__cxx11::string::~string(local_38);
  }
  return;
}

Assistant:

void Generator::FixContainingTypeInDescriptor(
    const DescriptorT& descriptor,
    const Descriptor* containing_descriptor) const {
  if (containing_descriptor != NULL) {
    const std::string nested_name = ModuleLevelDescriptorName(descriptor);
    const std::string parent_name =
        ModuleLevelDescriptorName(*containing_descriptor);
    printer_->Print("$nested_name$.containing_type = $parent_name$\n",
                    "nested_name", nested_name, "parent_name", parent_name);
  }
}